

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zeImageViewCreateExt
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_image_desc_t *desc,
          ze_image_handle_t hImage,ze_image_handle_t *phImageView)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar2 = context;
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeImageViewCreateExt(hContext, hDevice, desc, hImage, phImageView)"
             ,"");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(lVar2 + 0x398);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar2 + 0xd30);
    lVar2 = *(long *)(lVar2 + 0xd38);
    lVar5 = lVar2 - lVar6 >> 3;
    if (lVar2 != lVar6) {
      lVar7 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar7 * 8);
        result = (**(code **)(*plVar3 + 0xa60))(plVar3,hContext,hDevice,desc,hImage,phImageView);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0015ee85;
        lVar7 = lVar7 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
    }
    lVar7 = context;
    if ((*(char *)(context + 4) != '\x01') ||
       (result = ZEHandleLifetimeValidation::zeImageViewCreateExtPrologue
                           (*(ZEHandleLifetimeValidation **)(context + 0xd48),hContext,hDevice,desc,
                            hImage,phImageView), result == ZE_RESULT_SUCCESS)) {
      zVar4 = (*pcVar1)(hContext,hDevice,desc,hImage,phImageView);
      if (lVar2 != lVar6) {
        lVar6 = 0;
        do {
          plVar3 = (long *)**(undefined8 **)(*(long *)(lVar7 + 0xd30) + lVar6 * 8);
          result = (**(code **)(*plVar3 + 0xa68))
                             (plVar3,hContext,hDevice,desc,hImage,phImageView,zVar4);
          if (result != ZE_RESULT_SUCCESS) goto LAB_0015ee85;
          lVar6 = lVar6 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
      }
      result = zVar4;
      if (((zVar4 == ZE_RESULT_SUCCESS) && (phImageView != (ze_image_handle_t *)0x0)) &&
         (*(char *)(lVar7 + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(lVar7 + 0xd48),*phImageView);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar7 + 0xd48),hContext,*phImageView);
      }
    }
  }
LAB_0015ee85:
  logAndPropagateResult("zeImageViewCreateExt",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageViewCreateExt(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_handle_t hImage,                       ///< [in] handle of image object to create view from
        ze_image_handle_t* phImageView                  ///< [out] pointer to handle of image object created for view
        )
    {
        context.logger->log_trace("zeImageViewCreateExt(hContext, hDevice, desc, hImage, phImageView)");

        auto pfnViewCreateExt = context.zeDdiTable.Image.pfnViewCreateExt;

        if( nullptr == pfnViewCreateExt )
            return logAndPropagateResult("zeImageViewCreateExt", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeImageViewCreateExtPrologue( hContext, hDevice, desc, hImage, phImageView );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeImageViewCreateExt", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeImageViewCreateExtPrologue( hContext, hDevice, desc, hImage, phImageView );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeImageViewCreateExt", result);
        }

        auto driver_result = pfnViewCreateExt( hContext, hDevice, desc, hImage, phImageView );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeImageViewCreateExtEpilogue( hContext, hDevice, desc, hImage, phImageView ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeImageViewCreateExt", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phImageView){
                context.handleLifetime->addHandle( *phImageView );
                context.handleLifetime->addDependent( hContext, *phImageView );

            }
        }
        return logAndPropagateResult("zeImageViewCreateExt", driver_result);
    }